

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layers_unconditional_strided(fasthessian *fh)

{
  long in_RDI;
  int i_1;
  int i;
  integral_image *in_stack_00000048;
  response_layer *in_stack_00000050;
  integral_image *in_stack_00000098;
  response_layer *in_stack_000000a0;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    compute_response_layer_unconditional_strided(in_stack_000000a0,in_stack_00000098);
  }
  for (local_10 = 4; local_10 < *(int *)(in_RDI + 0x50); local_10 = local_10 + 1) {
    compute_response_layer_unconditional(in_stack_00000050,in_stack_00000048);
  }
  return;
}

Assistant:

void compute_response_layers_unconditional_strided(struct fasthessian* fh){

    for (int i = 0; i < 4; ++i) {
		compute_response_layer_unconditional_strided(fh->response_map[i], fh->iimage);
	}
    for (int i = 4; i < fh->total_layers; ++i) {
		compute_response_layer_unconditional(fh->response_map[i], fh->iimage);
	}
}